

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmmaparena.h
# Opt level: O1

void * __thiscall cookmem::MmapArena::getSegment(MmapArena *this,size_t *size)

{
  void *pvVar1;
  
  if (*size < this->m_minSize) {
    *size = this->m_minSize;
  }
  pvVar1 = mmap((void *)0x0,*size,this->m_prot,this->m_flag,-1,0);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    pvVar1 = (void *)0x0;
  }
  return pvVar1;
}

Assistant:

void*
    getSegment (std::size_t& size)
    {
        if (size < m_minSize)
        {
            size = m_minSize;
        }
        void* ptr = mmap(nullptr, size, m_prot, m_flag, -1, 0);
        if (ptr == MAP_FAILED)
        {
            return nullptr;
        }
        return ptr;
    }